

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,basic_string_view<char,_std::char_traits<char>_> *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_4)

{
  string_view data;
  string_view format_00;
  char *local_98;
  size_t local_90;
  char local_88;
  undefined7 uStack_87;
  size_t local_78;
  char *pcStack_70;
  size_type local_68;
  pointer local_60;
  size_t local_58;
  pointer local_50;
  size_type local_48;
  pointer local_40;
  size_type local_38;
  pointer local_30;
  
  format_00._M_len = format._M_str;
  local_78 = arg->_M_len;
  pcStack_70 = arg->_M_str;
  local_60 = (arg_1->_M_dataplus)._M_p;
  local_68 = arg_1->_M_string_length;
  local_50 = (arg_2->_M_dataplus)._M_p;
  local_58 = arg_2->_M_string_length;
  local_40 = (arg_3->_M_dataplus)._M_p;
  local_48 = arg_3->_M_string_length;
  local_30 = (arg_4->_M_dataplus)._M_p;
  local_38 = arg_4->_M_string_length;
  local_90 = 0;
  local_88 = '\0';
  format_00._M_str = (char *)&local_78;
  local_98 = &local_88;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_98,(Nonnull<std::string_*>)format._M_len,format_00,
             (Nullable<const_absl::string_view_*>)0x5,local_58);
  data._M_str = local_98;
  data._M_len = local_90;
  Write(this,data);
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }